

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall QFontDialogPrivate::retranslateStrings(QFontDialogPrivate *this)

{
  QLabel *pQVar1;
  QGroupBox *pQVar2;
  QCheckBox *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->familyAccel;
  QFontDialog::tr((QString *)&local_40,"&Font",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->styleAccel;
  QFontDialog::tr((QString *)&local_40,"Font st&yle",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->sizeAccel;
  QFontDialog::tr((QString *)&local_40,"&Size",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar2 = this->effects;
  QFontDialog::tr((QString *)&local_40,"Effects",(char *)0x0,-1);
  QGroupBox::setTitle(pQVar2,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar3 = this->strikeout;
  QFontDialog::tr((QString *)&local_40,"Stri&keout",(char *)0x0,-1);
  QAbstractButton::setText(&pQVar3->super_QAbstractButton,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar3 = this->underline;
  QFontDialog::tr((QString *)&local_40,"&Underline",(char *)0x0,-1);
  QAbstractButton::setText(&pQVar3->super_QAbstractButton,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar2 = this->sample;
  QFontDialog::tr((QString *)&local_40,"Sample",(char *)0x0,-1);
  QGroupBox::setTitle(pQVar2,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = this->writingSystemAccel;
  QFontDialog::tr((QString *)&local_40,"Wr&iting System",(char *)0x0,-1);
  QLabel::setText(pQVar1,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::retranslateStrings()
{
    familyAccel->setText(QFontDialog::tr("&Font"));
    styleAccel->setText(QFontDialog::tr("Font st&yle"));
    sizeAccel->setText(QFontDialog::tr("&Size"));
    effects->setTitle(QFontDialog::tr("Effects"));
    strikeout->setText(QFontDialog::tr("Stri&keout"));
    underline->setText(QFontDialog::tr("&Underline"));
    sample->setTitle(QFontDialog::tr("Sample"));
    writingSystemAccel->setText(QFontDialog::tr("Wr&iting System"));
}